

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int encode_session_identifier
              (ptls_buffer_t *buf,uint32_t ticket_age_add,st_ptls_key_schedule_t *sched,
              char *server_name,uint16_t csid)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  size_t len;
  size_t sVar8;
  uint32_t _v;
  timeval tv;
  timeval local_40;
  
  iVar4 = ptls_buffer_reserve(buf,2);
  if (iVar4 == 0) {
    puVar1 = buf->base;
    sVar2 = buf->off;
    (puVar1 + sVar2)[0] = '\0';
    (puVar1 + sVar2)[1] = '\0';
    sVar2 = buf->off;
    buf->off = sVar2 + 2;
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    iVar4 = ptls_buffer_reserve(buf,8);
    if (iVar4 == 0) {
      uVar5 = local_40.tv_sec * 1000 + local_40.tv_usec / 1000;
      *(ulong *)(buf->base + buf->off) =
           uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
           (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
           (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
      buf->off = buf->off + 8;
      iVar4 = ptls_buffer_reserve(buf,2);
      if (iVar4 == 0) {
        puVar1 = buf->base;
        sVar3 = buf->off;
        (puVar1 + sVar3)[0] = '\0';
        (puVar1 + sVar3)[1] = '\0';
        sVar3 = buf->off;
        buf->off = sVar3 + 2;
        iVar4 = ptls_buffer_reserve(buf,sched->algo->digest_size);
        if ((iVar4 == 0) &&
           (iVar4 = derive_secret(sched,buf->base + buf->off,"resumption master secret"), iVar4 == 0
           )) {
          sVar6 = buf->off + sched->algo->digest_size;
          buf->off = sVar6;
          lVar7 = sVar6 - (sVar3 + 2);
          buf->base[sVar3] = (uint8_t)((ulong)lVar7 >> 8);
          buf->base[sVar3 + 1] = (uint8_t)lVar7;
          iVar4 = ptls_buffer_reserve(buf,2);
          if (iVar4 == 0) {
            *(uint16_t *)(buf->base + buf->off) = csid << 8 | csid >> 8;
            buf->off = buf->off + 2;
            iVar4 = ptls_buffer_reserve(buf,4);
            if (iVar4 == 0) {
              *(uint32_t *)(buf->base + buf->off) =
                   ticket_age_add >> 0x18 | (ticket_age_add & 0xff0000) >> 8 |
                   (ticket_age_add & 0xff00) << 8 | ticket_age_add << 0x18;
              buf->off = buf->off + 4;
              iVar4 = ptls_buffer_reserve(buf,2);
              if (iVar4 == 0) {
                puVar1 = buf->base;
                sVar3 = buf->off;
                (puVar1 + sVar3)[0] = '\0';
                (puVar1 + sVar3)[1] = '\0';
                sVar6 = buf->off;
                sVar3 = sVar6 + 2;
                buf->off = sVar3;
                sVar8 = sVar3;
                if (server_name != (char *)0x0) {
                  len = strlen(server_name);
                  iVar4 = ptls_buffer__do_pushv(buf,server_name,len);
                  if (iVar4 != 0) {
                    return iVar4;
                  }
                  sVar8 = buf->off;
                }
                buf->base[sVar6] = (uint8_t)(sVar8 - sVar3 >> 8);
                buf->base[sVar6 + 1] = (uint8_t)(sVar8 - sVar3);
                lVar7 = buf->off - (sVar2 + 2);
                buf->base[sVar2] = (uint8_t)((ulong)lVar7 >> 8);
                buf->base[sVar2 + 1] = (uint8_t)lVar7;
                iVar4 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int encode_session_identifier(ptls_buffer_t *buf, uint32_t ticket_age_add, struct st_ptls_key_schedule_t *sched,
                              const char *server_name, uint16_t csid)
{
    int ret = 0;

    ptls_buffer_push_block(buf, 2, {
        /* date */
        ptls_buffer_push64(buf, gettime_millis());
        /* resumption master secret */
        ptls_buffer_push_block(buf, 2, {
            if ((ret = ptls_buffer_reserve(buf, sched->algo->digest_size)) != 0)
                goto Exit;
            if ((ret = derive_resumption_secret(sched, buf->base + buf->off)) != 0)
                goto Exit;
            buf->off += sched->algo->digest_size;
        });
        /* cipher-suite */
        ptls_buffer_push16(buf, csid);
        /* ticket_age_add */
        ptls_buffer_push32(buf, ticket_age_add);
        /* server-name */
        ptls_buffer_push_block(buf, 2, {
            if (server_name != NULL)
                ptls_buffer_pushv(buf, server_name, strlen(server_name));
        });
    });

Exit:
    return ret;
}